

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall llvm::detail::IEEEFloat::multiplySpecials(IEEEFloat *this,IEEEFloat *rhs)

{
  byte bVar1;
  
  bVar1 = this->field_0x12;
  switch((rhs->field_0x12 & 7) + (bVar1 & 7) * '\x04') {
  case 0:
  case 2:
  case 8:
    bVar1 = bVar1 & 0xf8;
    break;
  case 1:
  case 9:
  case 0xd:
    this->field_0x12 = (bVar1 & 0xf0) + 1;
    copySignificand(this,rhs);
    return opOK;
  case 3:
  case 0xc:
    makeNaN(this,false,false,(APInt *)0x0);
    return opInvalidOp;
  case 4:
  case 5:
  case 6:
  case 7:
    bVar1 = bVar1 & 0xf7;
    break;
  case 10:
    goto switchD_0015e24f_caseD_a;
  case 0xb:
  case 0xe:
  case 0xf:
    bVar1 = bVar1 & 0xf8 | 3;
    break;
  default:
    llvm_unreachable_internal
              ((char *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
               ,0x5e5);
  }
  this->field_0x12 = bVar1;
switchD_0015e24f_caseD_a:
  return opOK;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::multiplySpecials(const IEEEFloat &rhs) {
  switch (PackCategoriesIntoKey(category, rhs.category)) {
  default:
    llvm_unreachable(nullptr);

  case PackCategoriesIntoKey(fcNaN, fcZero):
  case PackCategoriesIntoKey(fcNaN, fcNormal):
  case PackCategoriesIntoKey(fcNaN, fcInfinity):
  case PackCategoriesIntoKey(fcNaN, fcNaN):
    sign = false;
    return opOK;

  case PackCategoriesIntoKey(fcZero, fcNaN):
  case PackCategoriesIntoKey(fcNormal, fcNaN):
  case PackCategoriesIntoKey(fcInfinity, fcNaN):
    sign = false;
    category = fcNaN;
    copySignificand(rhs);
    return opOK;

  case PackCategoriesIntoKey(fcNormal, fcInfinity):
  case PackCategoriesIntoKey(fcInfinity, fcNormal):
  case PackCategoriesIntoKey(fcInfinity, fcInfinity):
    category = fcInfinity;
    return opOK;

  case PackCategoriesIntoKey(fcZero, fcNormal):
  case PackCategoriesIntoKey(fcNormal, fcZero):
  case PackCategoriesIntoKey(fcZero, fcZero):
    category = fcZero;
    return opOK;

  case PackCategoriesIntoKey(fcZero, fcInfinity):
  case PackCategoriesIntoKey(fcInfinity, fcZero):
    makeNaN();
    return opInvalidOp;

  case PackCategoriesIntoKey(fcNormal, fcNormal):
    return opOK;
  }
}